

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imleInline.hpp
# Opt level: O1

void __thiscall IMLE::setParameters(IMLE *this,Param *prm)

{
  double *pdVar1;
  double *pdVar2;
  double *pdVar3;
  double *pdVar4;
  ulong uVar5;
  double dVar6;
  int iVar7;
  bool bVar8;
  undefined7 uVar9;
  Index index;
  ulong uVar10;
  long lVar11;
  Scal *pSVar12;
  Scal *pSVar13;
  byte bVar14;
  string local_38;
  
  bVar14 = 0;
  if ((prm->d == this->d) && (prm->D == this->D)) {
    (this->param).alpha = prm->alpha;
    iVar7 = prm->D;
    bVar8 = prm->accelerated;
    uVar9 = *(undefined7 *)&prm->field_0x9;
    (this->param).d = prm->d;
    (this->param).D = iVar7;
    (this->param).accelerated = bVar8;
    *(undefined7 *)&(this->param).field_0x9 = uVar9;
    pdVar3 = (prm->Psi0).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
             m_data;
    lVar11 = (prm->Psi0).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
             m_rows;
    if ((this->param).Psi0.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
        m_rows != lVar11) {
      Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                (&(this->param).Psi0.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,
                 lVar11,1);
    }
    pdVar4 = (this->param).Psi0.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
             m_storage.m_data;
    uVar5 = (this->param).Psi0.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
            m_storage.m_rows;
    uVar10 = uVar5 - ((long)uVar5 >> 0x3f) & 0xfffffffffffffffe;
    if (1 < (long)uVar5) {
      lVar11 = 0;
      do {
        pdVar1 = pdVar3 + lVar11;
        dVar6 = pdVar1[1];
        pdVar2 = pdVar4 + lVar11;
        *pdVar2 = *pdVar1;
        pdVar2[1] = dVar6;
        lVar11 = lVar11 + 2;
      } while (lVar11 < (long)uVar10);
    }
    if ((long)uVar10 < (long)uVar5) {
      do {
        pdVar4[uVar10] = pdVar3[uVar10];
        uVar10 = uVar10 + 1;
      } while (uVar5 != uVar10);
    }
    pSVar12 = &prm->sigma0;
    pSVar13 = &(this->param).sigma0;
    for (lVar11 = 0xb; lVar11 != 0; lVar11 = lVar11 + -1) {
      *pSVar13 = *pSVar12;
      pSVar12 = pSVar12 + (ulong)bVar14 * -2 + 1;
      pSVar13 = pSVar13 + (ulong)bVar14 * -2 + 1;
    }
    (this->param).saveOnExit = prm->saveOnExit;
    (this->param).iterMax = prm->iterMax;
    std::__cxx11::string::_M_assign((string *)&(this->param).defaultSave);
    set_internal_parameters(this);
    return;
  }
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_38,"IMLE::setParameters: parameter dimensions do not match!!","");
  message(this,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  return;
}

Assistant:

IMLE_CLASS_TEMPLATE
void IMLE_base::setParameters(Param const &prm)
{
#ifdef IMLE_NO_TEMPLATES
    // Check dimensions
    if( prm.d != d || prm.D != D)
    {
        message("IMLE::setParameters: parameter dimensions do not match!!");
        return;
    }
#endif

    param = prm;
    set_internal_parameters();
}